

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

Symbol __thiscall google::protobuf::DescriptorPool::Tables::FindSymbol(Tables *this,StringPiece key)

{
  __hash_code __c;
  __node_ptr p_Var1;
  _Hash_node_value<google::protobuf::Symbol,_true> *p_Var2;
  key_type local_48;
  SymbolBase local_40 [8];
  Symbol *local_38;
  size_type local_30;
  
  local_30 = key.length_;
  local_38 = (Symbol *)key.ptr_;
  local_48.ptr_ = local_40;
  local_40[0].symbol_type_ = '\n';
  __c = std::__detail::
        _Hash_code_base<google::protobuf::Symbol,_google::protobuf::Symbol,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
        ::_M_hash_code((_Hash_code_base<google::protobuf::Symbol,_google::protobuf::Symbol,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true>
                        *)&local_48,local_38);
  p_Var1 = std::
           _Hashtable<google::protobuf::Symbol,_google::protobuf::Symbol,_std::allocator<google::protobuf::Symbol>,_std::__detail::_Identity,_google::protobuf::(anonymous_namespace)::SymbolByFullNameEq,_google::protobuf::(anonymous_namespace)::SymbolByFullNameHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_node(&(this->symbols_by_name_)._M_h,
                          __c % (this->symbols_by_name_)._M_h._M_bucket_count,&local_48,__c);
  p_Var2 = (_Hash_node_value<google::protobuf::Symbol,_true> *)&(anonymous_namespace)::kNullSymbol;
  if (p_Var1 != (__node_ptr)0x0) {
    p_Var2 = &p_Var1->super__Hash_node_value<google::protobuf::Symbol,_true>;
  }
  return (Symbol)(p_Var2->super__Hash_node_value_base<google::protobuf::Symbol>)._M_storage.
                 _M_storage;
}

Assistant:

inline Symbol DescriptorPool::Tables::FindSymbol(StringPiece key) const {
  Symbol::QueryKey name;
  name.name = key;
  auto it = symbols_by_name_.find(Symbol(&name));
  return it == symbols_by_name_.end() ? kNullSymbol : *it;
}